

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_coverer.cc
# Opt level: O1

void __thiscall S2RegionCoverer::Options::set_min_level(Options *this,int min_level)

{
  S2LogMessage SStack_18;
  
  if (min_level < 0) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2region_coverer.cc"
               ,0x3e,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (min_level) >= (0) ",0x21);
  }
  else {
    if (min_level < 0x1f) {
      this->min_level_ = min_level;
      return;
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2region_coverer.cc"
               ,0x3f,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: (min_level) <= (S2CellId::kMaxLevel) ",0x33);
  }
  abort();
}

Assistant:

void S2RegionCoverer::Options::set_min_level(int min_level) {
  S2_DCHECK_GE(min_level, 0);
  S2_DCHECK_LE(min_level, S2CellId::kMaxLevel);
  // min_level() <= max_level() is checked by S2RegionCoverer.
  min_level_ = max(0, min(S2CellId::kMaxLevel, min_level));
}